

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CurrentSchemasBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pCVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  pointer pEVar6;
  type expr;
  ClientData *pCVar7;
  pointer pCVar8;
  vector<duckdb::CatalogSearchEntry,_true> *pvVar9;
  undefined8 *puVar10;
  BinderException *this_00;
  NotImplementedException *this_01;
  pointer pCVar11;
  vector<duckdb::Value,_true> schema_list;
  Value result_val;
  Value schema_value;
  string local_178;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_158;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_140;
  Value local_138;
  vector<duckdb::Value,_true> local_f8;
  LogicalType local_e0;
  LogicalType local_c8;
  Value local_b0;
  Value local_70;
  
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  if ((pEVar6->return_type).id_ != BOOLEAN) {
    this_00 = (BinderException *)__cxa_allocate_exception(0x10);
    local_138.type_._0_8_ = (long)&local_138 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"current_schemas requires a boolean input","");
    BinderException::BinderException(this_00,(string *)&local_138);
    __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  iVar4 = (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar6);
  if ((char)iVar4 != '\0') {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar5);
    ExpressionExecutor::EvaluateScalar(&local_70,context,expr,false);
    LogicalType::LogicalType(&local_c8,SQLNULL);
    Value::Value(&local_b0,&local_c8);
    LogicalType::~LogicalType(&local_c8);
    if (local_70.is_null == true) {
      LogicalType::LogicalType((LogicalType *)&local_178,VARCHAR);
      LogicalType::LIST(&local_e0,(LogicalType *)&local_178);
      Value::Value(&local_138,&local_e0);
      Value::operator=(&local_b0,&local_138);
      Value::~Value(&local_138);
      LogicalType::~LogicalType(&local_e0);
      LogicalType::~LogicalType((LogicalType *)&local_178);
    }
    else {
      bVar3 = BooleanValue::Get(&local_70);
      local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pCVar7 = ClientData::Get(context);
      local_140._M_head_impl = (FunctionData *)this;
      if (bVar3) {
        pCVar8 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                 ::operator->(&pCVar7->catalog_search_path);
        pvVar9 = CatalogSearchPath::Get(pCVar8);
      }
      else {
        pCVar8 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                 ::operator->(&pCVar7->catalog_search_path);
        pvVar9 = &pCVar8->set_paths;
      }
      pCVar11 = (pvVar9->
                super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                ).
                super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar1 = (pvVar9->
               super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
               ).
               super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pCVar11 != pCVar1) {
        do {
          pcVar2 = (pCVar11->schema)._M_dataplus._M_p;
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,pcVar2,pcVar2 + (pCVar11->schema)._M_string_length);
          Value::Value(&local_138,&local_178);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
          }
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_158,&local_138)
          ;
          Value::~Value(&local_138);
          pCVar11 = pCVar11 + 1;
        } while (pCVar11 != pCVar1);
      }
      LogicalType::LogicalType((LogicalType *)&local_178,VARCHAR);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f8,&local_158);
      this = (duckdb *)local_140._M_head_impl;
      Value::LIST(&local_138,(LogicalType *)&local_178,&local_f8);
      Value::operator=(&local_b0,&local_138);
      Value::~Value(&local_138);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f8);
      LogicalType::~LogicalType((LogicalType *)&local_178);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_158);
    }
    puVar10 = (undefined8 *)operator_new(0x48);
    Value::Value(&local_138,&local_b0);
    *puVar10 = &PTR__CurrentSchemasBindData_0247a4a0;
    Value::Value((Value *)(puVar10 + 1),&local_138);
    Value::~Value(&local_138);
    *(undefined8 **)this = puVar10;
    Value::~Value(&local_b0);
    Value::~Value(&local_70);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_138.type_._0_8_ = (long)&local_138 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"current_schemas requires a constant input","");
  NotImplementedException::NotImplementedException(this_01,(string *)&local_138);
  __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> CurrentSchemasBind(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->return_type.id() != LogicalTypeId::BOOLEAN) {
		throw BinderException("current_schemas requires a boolean input");
	}
	if (!arguments[0]->IsFoldable()) {
		throw NotImplementedException("current_schemas requires a constant input");
	}
	Value schema_value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	Value result_val;
	if (schema_value.IsNull()) {
		// null
		result_val = Value(LogicalType::LIST(LogicalType::VARCHAR));
	} else {
		auto implicit_schemas = BooleanValue::Get(schema_value);
		vector<Value> schema_list;
		auto &catalog_search_path = ClientData::Get(context).catalog_search_path;
		auto &search_path = implicit_schemas ? catalog_search_path->Get() : catalog_search_path->GetSetPaths();
		std::transform(search_path.begin(), search_path.end(), std::back_inserter(schema_list),
		               [](const CatalogSearchEntry &s) -> Value { return Value(s.schema); });
		result_val = Value::LIST(LogicalType::VARCHAR, schema_list);
	}
	return make_uniq<CurrentSchemasBindData>(std::move(result_val));
}